

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::GenVec<float,_4>::doApply
          (IRet *__return_storage_ptr__,GenVec<float,_4> *this,EvalContext *param_1,IArgs *iargs)

{
  IArgs *iargs_local;
  EvalContext *param_1_local;
  GenVec<float,_4> *this_local;
  
  tcu::Vector<tcu::Interval,_4>::Vector
            (__return_storage_ptr__,*iargs->a,*iargs->b,*iargs->c,*iargs->d);
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&, const IArgs& iargs) const
	{
		return IRet(iargs.a, iargs.b, iargs.c, iargs.d);
	}